

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_rr1_mul(DisasContext_conflict14 *ctx)

{
  TCGContext_conflict9 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  TCGv_i32 arg5;
  TCGv_i32 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i32 pTVar7;
  TCGv_i32 pTVar8;
  TCGv_i32 pTVar9;
  TCGv_i32 arg11_11;
  TCGv_i32 arg01_11;
  TCGv_i32 arg00_11;
  TCGv_i32 arg11_10;
  TCGv_i32 arg10_5;
  TCGv_i32 arg01_10;
  TCGv_i32 arg00_10;
  TCGv_i32 arg11_9;
  TCGv_i32 arg10_4;
  TCGv_i32 arg01_9;
  TCGv_i32 arg00_9;
  TCGv_i32 arg11_8;
  TCGv_i32 arg01_8;
  TCGv_i32 arg00_8;
  TCGv_i32 arg11_7;
  TCGv_i32 arg01_7;
  TCGv_i32 arg00_7;
  TCGv_i32 arg11_6;
  TCGv_i32 arg10_3;
  TCGv_i32 arg01_6;
  TCGv_i32 arg00_6;
  TCGv_i32 arg11_5;
  TCGv_i32 arg10_2;
  TCGv_i32 arg01_5;
  TCGv_i32 arg00_5;
  TCGv_i32 arg11_4;
  TCGv_i32 arg01_4;
  TCGv_i32 arg00_4;
  TCGv_i32 arg11_3;
  TCGv_i32 arg01_3;
  TCGv_i32 arg00_3;
  TCGv_i32 arg11_2;
  TCGv_i32 arg10_1;
  TCGv_i32 arg01_2;
  TCGv_i32 arg00_2;
  TCGv_i32 arg11_1;
  TCGv_i32 arg10;
  TCGv_i32 arg01_1;
  TCGv_i32 arg00_1;
  TCGv_i32 arg11;
  TCGv_i32 arg01;
  TCGv_i32 arg00;
  TCGv_i64 temp64;
  TCGv_i32 n;
  int r3;
  int r2;
  int r1;
  uint32_t op2;
  TCGContext_conflict9 *tcg_ctx;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,8,4);
  uVar2 = extract32(ctx->opcode,0xc,4);
  uVar3 = extract32(ctx->opcode,0x1c,4);
  uVar4 = extract32(ctx->opcode,0x10,2);
  arg5 = tcg_const_i32_tricore(tcg_ctx_00,uVar4);
  uVar4 = extract32(ctx->opcode,0x12,10);
  switch(uVar4) {
  case 0xc:
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar5,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mulr_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],pTVar7,pTVar8,pTVar9,pTVar5,arg5)
    ;
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    gen_calc_usb_mulr_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  case 0xd:
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar5,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mulr_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],pTVar7,pTVar8,pTVar9,pTVar5,arg5)
    ;
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    gen_calc_usb_mulr_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  case 0xe:
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mulr_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],pTVar7,pTVar8,pTVar9,pTVar9,arg5)
    ;
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    gen_calc_usb_mulr_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  case 0xf:
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    gen_helper_mulr_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],pTVar7,pTVar8,pTVar9,pTVar9,arg5)
    ;
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    gen_calc_usb_mulr_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  default:
    generate_trap(ctx,2,1);
    break;
  case 0x18:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar5,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mul_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar5,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    gen_calc_usb_mul_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)]
                      );
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x19:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar5,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mul_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar5,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    gen_calc_usb_mul_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)]
                      );
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x1a:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mul_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar9,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    gen_calc_usb_mul_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)]
                      );
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x1b:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    gen_helper_mul_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar9,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    gen_calc_usb_mul_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)]
                      );
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x1c:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar5,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mulm_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar5,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,0);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,tcg_ctx_00->cpu_PSW_V);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x1d:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar5,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mulm_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar5,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_temp_free_i32(tcg_ctx_00,pTVar5);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,0);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,tcg_ctx_00->cpu_PSW_V);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x1e:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2]);
    gen_helper_mulm_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar9,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,0);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,tcg_ctx_00->cpu_PSW_V);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x1f:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar1],0x10);
    tcg_gen_ext16s_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar1]);
    tcg_gen_sari_i32_tricore(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_gpr_d[(int)uVar2],0x10);
    gen_helper_mulm_h(tcg_ctx_00,pTVar6,pTVar7,pTVar8,pTVar9,pTVar9,arg5);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
               pTVar6);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,0);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,tcg_ctx_00->cpu_PSW_V);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
  }
  tcg_temp_free_i32(tcg_ctx_00,arg5);
  return;
}

Assistant:

static void decode_rr1_mul(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;

    int r1, r2, r3;
    TCGv n;
    TCGv_i64 temp64;

    r1 = MASK_OP_RR1_S1(ctx->opcode);
    r2 = MASK_OP_RR1_S2(ctx->opcode);
    r3 = MASK_OP_RR1_D(ctx->opcode);
    n  = tcg_const_i32(tcg_ctx, MASK_OP_RR1_N(ctx->opcode));
    op2 = MASK_OP_RR1_OP2(ctx->opcode);

    switch (op2) {
    case OPC2_32_RR1_MUL_H_32_LL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LL(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MUL_H_32_LU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LU(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MUL_H_32_UL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UL(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MUL_H_32_UU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UU(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_LL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LL(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_LU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LU(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_UL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UL(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_UU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UU(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);

        break;
    case OPC2_32_RR1_MULR_H_16_LL:
        GEN_HELPER_LL(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    case OPC2_32_RR1_MULR_H_16_LU:
        GEN_HELPER_LU(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    case OPC2_32_RR1_MULR_H_16_UL:
        GEN_HELPER_UL(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    case OPC2_32_RR1_MULR_H_16_UU:
        GEN_HELPER_UU(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_temp_free(tcg_ctx, n);
}